

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  undefined4 *puVar1;
  bool bVar2;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int max_std_funcs;
  int AMDisbetter_ [3];
  int AuthenticAMD [3];
  int GenuineIntel [3];
  int abcd [4];
  int max_std_funcs_00;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int *l1_00;
  int local_34 [4];
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int *local_18;
  int *local_10;
  int *local_8;
  
  local_34[0] = 0x756e6547;
  local_34[1] = 0x49656e69;
  local_34[2] = 0x6c65746e;
  l1_00 = (int *)0x69746e6568747541;
  iVar4 = 0x69444d41;
  uVar5 = 0x74656273;
  uVar6 = 0x21726574;
  puVar1 = (undefined4 *)cpuid_basic_info(0);
  local_34[3] = *puVar1;
  max_std_funcs_00 = puVar1[1];
  local_1c = puVar1[2];
  local_20 = puVar1[3];
  iVar3 = max_std_funcs_00;
  local_24 = max_std_funcs_00;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar2 = cpuid_is_vendor(local_34 + 3,local_34);
  if (bVar2) {
    queryCacheSizes_intel
              (l1_00,(int *)CONCAT44(uVar6,uVar5),(int *)CONCAT44(iVar4,iVar3),max_std_funcs_00);
  }
  else {
    bVar2 = cpuid_is_vendor(local_34 + 3,(int *)&stack0xffffffffffffffc0);
    if ((bVar2) || (bVar2 = cpuid_is_vendor(local_34 + 3,(int *)&stack0xffffffffffffffb4), bVar2)) {
      queryCacheSizes_amd(local_8,local_10,local_18);
    }
    else {
      queryCacheSizes_intel
                (l1_00,(int *)CONCAT44(uVar6,uVar5),(int *)CONCAT44(iVar4,iVar3),max_std_funcs_00);
    }
  }
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[1];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}